

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

void ParseOptions(int argc,char **argv)

{
  byte bVar1;
  byte *__s2;
  size_type sVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  ostream *poVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  long *local_90;
  undefined8 local_88;
  long local_80 [2];
  long *local_70;
  undefined8 uStack_68;
  long local_60 [2];
  bool local_50;
  bool bStack_4f;
  undefined1 uStack_4e;
  ulong local_48;
  char **local_40;
  int local_34;
  
  uStack_68 = 0;
  local_60[1] = 0;
  local_80[0] = 0;
  local_80[1] = 0;
  _local_50 = 0;
  local_88 = 0;
  local_60[0] = 0;
  local_90 = local_80;
  local_70 = local_60;
  local_40 = argv;
  local_34 = argc;
  std::__cxx11::string::operator=((string *)&g_options,(string *)&local_90);
  std::__cxx11::string::operator=((string *)&g_options.input_file,(string *)&local_70);
  uVar5 = _local_50;
  g_options.gc_stress = local_50;
  g_options.heap_verify = bStack_4f;
  uStack_4e = SUB81(uVar5,2);
  g_options.emit_warnings = (bool)uStack_4e;
  _local_50 = uVar5;
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (1 < local_34) {
    iVar9 = 1;
    local_48 = 0;
    do {
      __s2 = (byte *)local_40[iVar9];
      bVar1 = *__s2;
      iVar7 = -(bVar1 - 0x2d);
      iVar4 = iVar7;
      if (bVar1 == 0x2d) {
        uVar3 = __s2[1] - 0x68;
        if (uVar3 == 0) {
          uVar3 = (uint)__s2[2];
        }
        iVar4 = -uVar3;
      }
      if (iVar4 == 0) {
LAB_0011b35a:
        poVar6 = std::operator<<((ostream *)&std::cout,usage);
        std::endl<char,std::char_traits<char>>(poVar6);
        exit(0);
      }
      pcVar8 = "--help";
      iVar4 = strcmp("--help",(char *)__s2);
      if (iVar4 == 0) goto LAB_0011b35a;
      iVar4 = iVar7;
      if (bVar1 == 0x2d) {
        uVar3 = __s2[1] - 0x73;
        if (uVar3 == 0) {
          uVar3 = (uint)__s2[2];
        }
        iVar4 = -uVar3;
      }
      if (iVar4 == 0) {
LAB_0011b2af:
        sVar2 = g_options.stdlib_path._M_string_length;
        iVar4 = iVar9 + 1;
        if (local_34 <= iVar4) {
          ParseError(pcVar8);
        }
        iVar9 = iVar9 + 2;
        pcVar8 = local_40[iVar4];
        strlen(pcVar8);
        std::__cxx11::string::_M_replace(0x126f70,0,(char *)sVar2,(ulong)pcVar8);
      }
      else {
        pcVar8 = "--stdlib-path";
        iVar4 = strcmp("--stdlib-path",(char *)__s2);
        if (iVar4 == 0) goto LAB_0011b2af;
        if (bVar1 == 0x2d) {
          uVar3 = __s2[1] - 0x77;
          if (uVar3 == 0) {
            uVar3 = (uint)__s2[2];
          }
          iVar7 = -uVar3;
        }
        if ((iVar7 == 0) || (iVar4 = strcmp("--warnings",(char *)__s2), iVar4 == 0)) {
          iVar9 = iVar9 + 1;
          g_options.emit_warnings = true;
        }
        else {
          iVar4 = strcmp("--gc-stress",(char *)__s2);
          if (iVar4 == 0) {
            iVar9 = iVar9 + 1;
            g_options.gc_stress = true;
          }
          else {
            iVar4 = strcmp("--heap-verify",(char *)__s2);
            sVar2 = g_options.input_file._M_string_length;
            if (iVar4 == 0) {
              iVar9 = iVar9 + 1;
              g_options.heap_verify = true;
            }
            else {
              if ((local_48 & 1) != 0) {
                poVar6 = std::operator<<((ostream *)&std::cout,"unexpected positional argument: ");
                poVar6 = std::operator<<(poVar6,local_40[iVar9]);
                std::endl<char,std::char_traits<char>>(poVar6);
                exit(1);
              }
              iVar9 = iVar9 + 1;
              strlen((char *)__s2);
              uVar5 = std::__cxx11::string::_M_replace(0x126f90,0,(char *)sVar2,(ulong)__s2);
              local_48 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            }
          }
        }
      }
    } while (iVar9 < local_34);
  }
  return;
}

Assistant:

void ParseOptions(int argc, char **argv) {
  g_options = Options();
  int i = 1;
  bool seen_input_file = false;
  while (i < argc) {
    if (strcmp("-h", argv[i]) == 0 || strcmp("--help", argv[i]) == 0) {
      std::cout << usage << std::endl;
      std::exit(0);
    }

    if (strcmp("-s", argv[i]) == 0 || strcmp("--stdlib-path", argv[i]) == 0) {
      i++;
      if (i >= argc) {
        ParseError("expected argument for standard library path");
      }

      g_options.stdlib_path = argv[i++];
      continue;
    }

    if (strcmp("-w", argv[i]) == 0 || strcmp("--warnings", argv[i]) == 0) {
      i++;
      g_options.emit_warnings = true;
      continue;
    }

    if (strcmp("--gc-stress", argv[i]) == 0) {
      i++;
      g_options.gc_stress = true;
      continue;
    }

    if (strcmp("--heap-verify", argv[i]) == 0) {
      i++;
      g_options.heap_verify = true;
      continue;
    }

    if (!seen_input_file) {
      seen_input_file = true;
      g_options.input_file = argv[i++];
    } else {
      std::cout << "unexpected positional argument: " << argv[i] << std::endl;
      std::exit(1);
    }
  }
}